

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::Implicit_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::Implicit_const&> *this,Implicit *rhs)

{
  result *prVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  result *extraout_RAX;
  result *extraout_RAX_00;
  result *prVar5;
  ostringstream os;
  ulong *local_290;
  ulong local_280;
  undefined8 uStack_278;
  string local_270;
  result *local_250;
  size_type local_248;
  undefined1 local_240 [16];
  result *local_230;
  undefined1 local_228 [16];
  pointer pcStack_218;
  ulong *local_210;
  ulong local_200;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  bool local_1f0;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar3 = *(int *)this;
  iVar2 = rhs->x;
  prVar1 = (result *)(local_228 + 8);
  local_230 = prVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"==","");
  local_250 = (result *)local_240;
  if (local_230 == prVar1) {
    local_240._8_8_ = pcStack_218;
  }
  else {
    local_250 = local_230;
  }
  local_248 = local_228._0_8_;
  local_228._0_8_ = 0;
  local_228[8] = '\0';
  local_230 = prVar1;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  to_string<(anonymous_namespace)::Implicit>(&local_270,(Implicit *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_250->passed,local_248);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  to_string<(anonymous_namespace)::Implicit>(&local_1c8,rhs);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p == &local_270.field_2) {
    uStack_278 = local_270.field_2._8_8_;
    local_290 = &local_280;
  }
  else {
    local_290 = (ulong *)local_270._M_dataplus._M_p;
  }
  local_280 = local_270.field_2._M_allocated_capacity;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_290 == &local_280) {
    uStack_1f8 = (undefined4)uStack_278;
    uStack_1f4 = uStack_278._4_4_;
    local_290 = &local_200;
  }
  local_280 = local_280 & 0xffffffffffffff00;
  local_210 = local_290;
  local_1f0 = iVar3 == iVar2;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_290,(long)local_290 + local_270._M_string_length);
  __return_storage_ptr__->passed = local_1f0;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_1e8,local_1e8 + local_1e0);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  prVar5 = (result *)local_240;
  if (local_250 != prVar5) {
    operator_delete(local_250);
    prVar5 = extraout_RAX;
  }
  if (local_230 != prVar1) {
    operator_delete(local_230);
    prVar5 = extraout_RAX_00;
  }
  return prVar5;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }